

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcTShapeProfileDef::IfcTShapeProfileDef(IfcTShapeProfileDef *this)

{
  IfcTShapeProfileDef *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x100,"IfcTShapeProfileDef");
  IfcParameterizedProfileDef::IfcParameterizedProfileDef
            (&this->super_IfcParameterizedProfileDef,&PTR_construction_vtable_24__00e41d00);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcTShapeProfileDef,_10UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcTShapeProfileDef,_10UL> *)
             &(this->super_IfcParameterizedProfileDef).field_0x70,
             &PTR_construction_vtable_24__00e41d48);
  (this->super_IfcParameterizedProfileDef).super_IfcProfileDef.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>._vptr_ObjectHelper =
       (_func_int **)0xe41c70;
  *(undefined8 *)&this->field_0x100 = 0xe41ce8;
  *(undefined8 *)&(this->super_IfcParameterizedProfileDef).super_IfcProfileDef.field_0x58 = 0xe41c98
  ;
  *(undefined8 *)&(this->super_IfcParameterizedProfileDef).field_0x70 = 0xe41cc0;
  STEP::Maybe<double>::Maybe(&this->FilletRadius);
  STEP::Maybe<double>::Maybe(&this->FlangeEdgeRadius);
  STEP::Maybe<double>::Maybe(&this->WebEdgeRadius);
  STEP::Maybe<double>::Maybe(&this->WebSlope);
  STEP::Maybe<double>::Maybe(&this->FlangeSlope);
  STEP::Maybe<double>::Maybe(&this->CentreOfGravityInY);
  return;
}

Assistant:

IfcTShapeProfileDef() : Object("IfcTShapeProfileDef") {}